

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

int md5_done(hash_state *md,uchar *out)

{
  uint uVar1;
  ulong32 __t_1;
  ulong64 __t;
  int i;
  uchar *out_local;
  hash_state *md_local;
  
  if (md == (hash_state *)0x0) {
    crypt_argchk("md != NULL",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/libtomcrypt/src/hashes/md5.c"
                 ,0x108);
  }
  if (out == (uchar *)0x0) {
    crypt_argchk("out != NULL",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/libtomcrypt/src/hashes/md5.c"
                 ,0x109);
  }
  if ((md->sha1).state[4] < 0x40) {
    md->data = (void *)((ulong)((md->sha1).state[4] << 3) + (long)md->data);
    uVar1 = (md->sha1).state[4];
    (md->sha1).state[4] = uVar1 + 1;
    *(undefined1 *)((long)md + (ulong)uVar1 + 0x1c) = 0x80;
    if (0x38 < (md->sha1).state[4]) {
      while ((md->sha1).state[4] < 0x40) {
        uVar1 = (md->sha1).state[4];
        (md->sha1).state[4] = uVar1 + 1;
        *(undefined1 *)((long)md + (ulong)uVar1 + 0x1c) = 0;
      }
      md5_compress(md,(md->md5).buf);
      (md->sha1).state[4] = 0;
    }
    while ((md->sha1).state[4] < 0x38) {
      uVar1 = (md->sha1).state[4];
      (md->sha1).state[4] = uVar1 + 1;
      *(undefined1 *)((long)md + (ulong)uVar1 + 0x1c) = 0;
    }
    *(ulong64 *)((md->sha1).buf + 0x34) = (md->sha1).length;
    md5_compress(md,(md->md5).buf);
    for (__t._4_4_ = 0; __t._4_4_ < 4; __t._4_4_ = __t._4_4_ + 1) {
      *(undefined4 *)(out + (__t._4_4_ << 2)) = *(undefined4 *)((long)md + (long)__t._4_4_ * 4 + 8);
    }
    md_local._4_4_ = 0;
  }
  else {
    md_local._4_4_ = 0x10;
  }
  return md_local._4_4_;
}

Assistant:

int md5_done(hash_state * md, unsigned char *out)
{
    int i;

    LTC_ARGCHK(md  != NULL);
    LTC_ARGCHK(out != NULL);

    if (md->md5.curlen >= sizeof(md->md5.buf)) {
       return CRYPT_INVALID_ARG;
    }


    /* increase the length of the message */
    md->md5.length += md->md5.curlen * 8;

    /* append the '1' bit */
    md->md5.buf[md->md5.curlen++] = (unsigned char)0x80;

    /* if the length is currently above 56 bytes we append zeros
     * then compress.  Then we can fall back to padding zeros and length
     * encoding like normal.
     */
    if (md->md5.curlen > 56) {
        while (md->md5.curlen < 64) {
            md->md5.buf[md->md5.curlen++] = (unsigned char)0;
        }
        md5_compress(md, md->md5.buf);
        md->md5.curlen = 0;
    }

    /* pad upto 56 bytes of zeroes */
    while (md->md5.curlen < 56) {
        md->md5.buf[md->md5.curlen++] = (unsigned char)0;
    }

    /* store length */
    STORE64L(md->md5.length, md->md5.buf+56);
    md5_compress(md, md->md5.buf);

    /* copy output */
    for (i = 0; i < 4; i++) {
        STORE32L(md->md5.state[i], out+(4*i));
    }
#ifdef LTC_CLEAN_STACK
    zeromem(md, sizeof(hash_state));
#endif
    return CRYPT_OK;
}